

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O0

int xio_open(XIO_HANDLE xio,ON_IO_OPEN_COMPLETE on_io_open_complete,
            void *on_io_open_complete_context,ON_BYTES_RECEIVED on_bytes_received,
            void *on_bytes_received_context,ON_IO_ERROR on_io_error,void *on_io_error_context)

{
  int iVar1;
  XIO_INSTANCE *xio_instance;
  int result;
  ON_IO_ERROR on_io_error_local;
  void *on_bytes_received_context_local;
  ON_BYTES_RECEIVED on_bytes_received_local;
  void *on_io_open_complete_context_local;
  ON_IO_OPEN_COMPLETE on_io_open_complete_local;
  XIO_HANDLE xio_local;
  
  if (xio == (XIO_HANDLE)0x0) {
    xio_instance._4_4_ = 0x51;
  }
  else {
    iVar1 = (*xio->io_interface_description->concrete_io_open)
                      (xio->concrete_xio_handle,on_io_open_complete,on_io_open_complete_context,
                       on_bytes_received,on_bytes_received_context,on_io_error,on_io_error_context);
    if (iVar1 == 0) {
      xio_instance._4_4_ = 0;
    }
    else {
      xio_instance._4_4_ = 0x5b;
    }
  }
  return xio_instance._4_4_;
}

Assistant:

int xio_open(XIO_HANDLE xio, ON_IO_OPEN_COMPLETE on_io_open_complete, void* on_io_open_complete_context, ON_BYTES_RECEIVED on_bytes_received, void* on_bytes_received_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    int result;

    if (xio == NULL)
    {
        /* Codes_SRS_XIO_01_021: [If handle is NULL, xio_open shall return a non-zero value.] */
        result = MU_FAILURE;
    }
    else
    {
        XIO_INSTANCE* xio_instance = (XIO_INSTANCE*)xio;

        /* Codes_SRS_XIO_01_019: [xio_open shall call the specific concrete_xio_open function specified in xio_create, passing callback function and context arguments for three events: open completed, bytes received, and IO error.] */
        if (xio_instance->io_interface_description->concrete_io_open(xio_instance->concrete_xio_handle, on_io_open_complete, on_io_open_complete_context, on_bytes_received, on_bytes_received_context, on_io_error, on_io_error_context) != 0)
        {
            /* Codes_SRS_XIO_01_022: [If the underlying concrete_io_open fails, xio_open shall return a non-zero value.] */
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_XIO_01_020: [On success, xio_open shall return 0.] */
            result = 0;
        }
    }

    return result;
}